

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int get_mvpred_compound_sad
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,buf_2d *src,uint8_t *ref_address,
              int ref_stride)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint uVar5;
  
  puVar2 = (ms_params->ms_buffers).second_pred;
  puVar3 = src->buf;
  iVar1 = src->stride;
  puVar4 = (ms_params->ms_buffers).mask;
  if (puVar4 != (uint8_t *)0x0) {
    uVar5 = (*ms_params->vfp->msdf)
                      (puVar3,iVar1,ref_address,ref_stride,puVar2,puVar4,
                       (ms_params->ms_buffers).mask_stride,(ms_params->ms_buffers).inv_mask);
    return uVar5;
  }
  if (puVar2 != (uint8_t *)0x0) {
    uVar5 = (*ms_params->vfp->sdaf)(puVar3,iVar1,ref_address,ref_stride,puVar2);
    return uVar5;
  }
  uVar5 = (*ms_params->sdf)(puVar3,iVar1,ref_address,ref_stride);
  return uVar5;
}

Assistant:

static inline int get_mvpred_compound_sad(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const struct buf_2d *const src, const uint8_t *const ref_address,
    const int ref_stride) {
  const aom_variance_fn_ptr_t *vfp = ms_params->vfp;
  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;

  const uint8_t *mask = ms_params->ms_buffers.mask;
  const uint8_t *second_pred = ms_params->ms_buffers.second_pred;
  const int mask_stride = ms_params->ms_buffers.mask_stride;
  const int invert_mask = ms_params->ms_buffers.inv_mask;

  if (mask) {
    return vfp->msdf(src_buf, src_stride, ref_address, ref_stride, second_pred,
                     mask, mask_stride, invert_mask);
  } else if (second_pred) {
    assert(vfp->sdaf != NULL);
    return vfp->sdaf(src_buf, src_stride, ref_address, ref_stride, second_pred);
  } else {
    return ms_params->sdf(src_buf, src_stride, ref_address, ref_stride);
  }
}